

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::call(cni_helper<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  vector *in_RDX;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> local_70;
  
  if ((long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    cni_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>(*)(std::__cxx11::string_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),std::deque<cs_impl::any,std::allocator<cs_impl::any>>(*)(std::__cxx11::string_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
    ::_call<0,1>(&local_70,args,in_RDX,(sequence<0,_1> *)&cov::make_sequence<0,0,1>::result);
    any::
    make_constant<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&>
              ((any *)this,&local_70);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(&local_70);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_d0,2);
  std::operator+(&local_b0,"Wrong size of the arguments. Expected ",&local_d0);
  std::operator+(&local_90,&local_b0,", provided ");
  std::__cxx11::to_string
            (&local_f0,
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                 &local_90,&local_f0);
  cs::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}